

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::LogSumExp::backward_impl
          (LogSumExp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  size_type sVar1;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  uint in_R8D;
  double __x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd68;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd78;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd80;
  Tensor *in_stack_fffffffffffffd88;
  ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  local_170 [332];
  uint local_24;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_24 = in_R8D;
  local_10 = in_RSI;
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar1 == 0) {
    Tensor::operator*(in_stack_fffffffffffffd88);
    Tensor::operator*(in_stack_fffffffffffffd88);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator+=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  else {
    Tensor::operator*(in_stack_fffffffffffffd88);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
              (local_10,(ulong)local_24);
    Tensor::operator*(in_stack_fffffffffffffd88);
    Tensor::operator*(in_stack_fffffffffffffd88);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator-((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>
    ::array((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
             *)in_stack_fffffffffffffd68);
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
    ::exp(local_170,__x);
    Tensor::operator*(in_stack_fffffffffffffd88);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::array(in_stack_fffffffffffffd68);
    Eigen::
    ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>const>const>>
    ::operator*((ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                 *)in_stack_fffffffffffffd88,
                (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)in_stack_fffffffffffffd80);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::array(in_stack_fffffffffffffd68);
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>>
    ::operator+=((ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)in_stack_fffffffffffffd80,
                 (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                  *)in_stack_fffffffffffffd78);
  }
  return;
}

Assistant:

void LogSumExp::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  if (xs.size() == 0) {
    *dEdxi += *dEdf;
    return;
  }
  // df/dx_i = 1/{sum_j exp(x_j)} * exp(x_i)}
  //         = 1/{exp f(x)} * exp(x_i)
  //         = exp(x_i - f(x))
  auto d = *dEdxi;
  d.array() += (**xs[i] - *fx).array().exp() * (*dEdf).array();
}